

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml.c
# Opt level: O2

void av1_nn_fast_softmax_16_c(float *input,float *output)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar2 = *input;
  for (lVar1 = 1; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    if (fVar2 <= input[lVar1]) {
      fVar2 = input[lVar1];
    }
  }
  fVar3 = 0.0;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    fVar4 = input[lVar1] - fVar2;
    if (fVar4 <= -10.0) {
      fVar4 = -10.0;
    }
    fVar4 = (float)((int)(fVar4 * 12102203.0) + 0x3f7f127f);
    output[lVar1] = fVar4;
    fVar3 = fVar3 + fVar4;
  }
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    output[lVar1] = output[lVar1] / fVar3;
  }
  return;
}

Assistant:

void av1_nn_fast_softmax_16_c(const float *input, float *output) {
  const int kNumClasses = 16;
  float max_input = input[0];
  for (int i = 1; i < kNumClasses; i++) max_input = AOMMAX(max_input, input[i]);
  float sum_out = 0.0f;
  for (int i = 0; i < kNumClasses; i++) {
    // Clamp to range [-10.0, 0.0] to prevent FE_UNDERFLOW errors.
    const float normalized_input = AOMMAX(input[i] - max_input, -10.0f);
    output[i] = approx_exp(normalized_input);
    sum_out += output[i];
  }
  for (int i = 0; i < kNumClasses; i++) output[i] /= sum_out;
}